

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

int engine_load(TLS_IO_INSTANCE *tls)

{
  int iVar1;
  ENGINE *pEVar2;
  
  pEVar2 = ENGINE_by_id(tls->engine_id);
  tls->engine = (ENGINE *)pEVar2;
  iVar1 = 0;
  if (pEVar2 == (ENGINE *)0x0) {
    log_ERR_get_error("unable to load engine by ID.");
    iVar1 = 0x30d;
  }
  return iVar1;
}

Assistant:

int engine_load(TLS_IO_INSTANCE* tls)
{
    int result;

    // TLSIO is only responsible for the Engine structural reference.
    tls->engine = ENGINE_by_id(tls->engine_id);
    if (tls->engine == NULL)
    {
        log_ERR_get_error("unable to load engine by ID.");
        result = MU_FAILURE;
    }
    else
    {
        result = 0;
    }

    return result;
}